

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effects.h
# Opt level: O2

void __thiscall
wasm::EffectAnalyzer::InternalAnalyzer::visitArrayLen(InternalAnalyzer *this,ArrayLen *curr)

{
  bool bVar1;
  
  bVar1 = Type::isNull((Type *)(*(long *)(curr + 0x10) + 8));
  if (bVar1) {
    this->parent->trap = true;
  }
  else if (((uint)*(ulong *)(*(long *)(curr + 0x10) + 8) & 3) == 2 &&
           6 < *(ulong *)(*(long *)(curr + 0x10) + 8)) {
    this->parent->implicitTrap = true;
  }
  return;
}

Assistant:

void visitArrayLen(ArrayLen* curr) {
      if (curr->ref->type.isNull()) {
        parent.trap = true;
        return;
      }
      // traps when the arg is null
      if (curr->ref->type.isNullable()) {
        parent.implicitTrap = true;
      }
    }